

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentLeafNameTypeVector.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ContentLeafNameTypeVector::ContentLeafNameTypeVector
          (ContentLeafNameTypeVector *this,ContentLeafNameTypeVector *toCopy)

{
  EVP_PKEY_CTX *ctx;
  NodeTypes NVar1;
  QName *pQVar2;
  XMLSize_t i;
  ulong pos;
  
  this->fMemoryManager = toCopy->fMemoryManager;
  this->fLeafCount = 0;
  this->fLeafNames = (QName **)0x0;
  this->fLeafTypes = (NodeTypes *)0x0;
  ctx = (EVP_PKEY_CTX *)toCopy->fLeafCount;
  this->fLeafCount = (XMLSize_t)ctx;
  init(this,ctx);
  for (pos = 0; pos < this->fLeafCount; pos = pos + 1) {
    pQVar2 = getLeafNameAt(toCopy,pos);
    this->fLeafNames[pos] = pQVar2;
    NVar1 = getLeafTypeAt(toCopy,pos);
    this->fLeafTypes[pos] = NVar1;
  }
  return;
}

Assistant:

ContentLeafNameTypeVector::ContentLeafNameTypeVector
(
    const ContentLeafNameTypeVector& toCopy
)
: XMemory(toCopy)
, fMemoryManager(toCopy.fMemoryManager)
, fLeafNames(0)
, fLeafTypes(0)
, fLeafCount(0)
{
    fLeafCount=toCopy.getLeafCount();
    init(fLeafCount);

    for (XMLSize_t i=0; i<this->fLeafCount; i++)
    {
        fLeafNames[i] = toCopy.getLeafNameAt(i);
        fLeafTypes[i] = toCopy.getLeafTypeAt(i);
    }
}